

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O2

int __thiscall
ON_Viewport::GetBoundingBoxDepth
          (ON_Viewport *this,ON_BoundingBox bbox,ON_Xform *bbox_xform,double *near_dist,
          double *far_dist,bool bGrowNearFar)

{
  view_projection vVar1;
  ON_3dPoint P;
  ON_3dPoint P_00;
  ON_3dVector N;
  double *pdVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  ON_PlaneEquation *this_00;
  ON_3dPoint *this_01;
  ON_3dPoint *pOVar10;
  ON_Viewport *this_02;
  uint uVar11;
  byte bVar12;
  long lVar13;
  uint uVar14;
  ON_Line *line;
  long lVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar18;
  double t [2];
  ulong local_a68;
  ulong local_a58;
  ON_3dPoint local_a30;
  undefined4 local_a18;
  uint uStack_a14;
  undefined4 uStack_a10;
  uint uStack_a0c;
  ON_Viewport *local_a00;
  ON_3dVector *local_9f8;
  double *local_9f0;
  undefined1 local_9e8 [16];
  ON_Xform *local_9d8;
  ulong local_9d0;
  double local_9c8;
  double dStack_9c0;
  double local_9b8;
  double Lbuffer [24];
  ON_3dPoint local_8e0;
  double Sbuffer [20];
  ON_3dPoint local_828;
  ON_3dVector local_810;
  double v [4] [8];
  double Pbuffer [216];
  
  this_01 = &this->m_CamLoc;
  local_9f0 = far_dist;
  dVar18 = ON_3dPoint::MaximumCoordinate(this_01);
  local_9e8._8_4_ = extraout_XMM0_Dc;
  local_9e8._0_8_ = dVar18;
  local_9e8._12_4_ = extraout_XMM0_Dd;
  vVar1 = this->m_projection;
  pOVar10 = (ON_3dPoint *)Pbuffer;
  bVar3 = ON_BoundingBox::GetCorners(&bbox,pOVar10);
  if (!bVar3) {
    return 0;
  }
  if ((bbox_xform != (ON_Xform *)0x0) && (bVar3 = ON_Xform::IsValid(bbox_xform), !bVar3)) {
    return 0;
  }
  bVar3 = GetFrustumLeftPlaneEquation(this,(ON_PlaneEquation *)Sbuffer);
  if (!bVar3) {
    return 0;
  }
  bVar3 = GetFrustumRightPlaneEquation(this,(ON_PlaneEquation *)(Sbuffer + 4));
  if (!bVar3) {
    return 0;
  }
  bVar3 = GetFrustumBottomPlaneEquation(this,(ON_PlaneEquation *)(Sbuffer + 8));
  if (!bVar3) {
    return 0;
  }
  bVar3 = GetFrustumTopPlaneEquation(this,(ON_PlaneEquation *)(Sbuffer + 0xc));
  if (!bVar3) {
    return 0;
  }
  uVar16 = local_9e8._12_4_;
  local_9e8._8_4_ = local_9e8._8_4_;
  local_9e8._0_8_ = (local_9e8._0_8_ + 1.0) * 1.490116119385e-08;
  local_9e8._12_4_ = uVar16;
  local_9b8 = (this->m_CamLoc).z;
  local_9c8 = this_01->x;
  dStack_9c0 = (this->m_CamLoc).y;
  local_9f8 = &this->m_CamZ;
  local_a00 = this;
  local_9d8 = bbox_xform;
  ON_3dVector::operator-(&local_810,local_9f8);
  P.y = dStack_9c0;
  P.x = local_9c8;
  P.z = local_9b8;
  N.y = local_810.y;
  N.x = local_810.x;
  N.z = local_810.z;
  ON_PlaneEquation::Create((ON_PlaneEquation *)(Sbuffer + 0x10),P,N);
  uStack_a14 = local_9e8._4_4_ ^ 0x80000000;
  uStack_a0c = local_9e8._12_4_ ^ 0x80000000;
  uStack_a10 = local_9e8._8_4_;
  local_a18 = local_9e8._0_4_;
  bVar7 = 0;
  lVar9 = -0x40;
  uVar14 = 0;
  local_a58 = 0;
  while( true ) {
    this_02 = local_a00;
    uVar5 = (uint)local_a58;
    if (lVar9 == 0) break;
    local_9d0 = local_a58;
    if (local_9d8 != (ON_Xform *)0x0) {
      ON_Xform::operator*((ON_3dPoint *)Lbuffer,local_9d8,pOVar10);
      pOVar10->z = Lbuffer[2];
      pOVar10->x = Lbuffer[0];
      pOVar10->y = Lbuffer[1];
    }
    dVar18 = ON_PlaneEquation::ValueAt((ON_PlaneEquation *)Sbuffer,*pOVar10);
    bVar3 = dVar18 < (double)CONCAT44(uStack_a14,local_a18);
    *(double *)((long)v[1] + lVar9) = dVar18;
    bVar12 = !bVar3;
    uVar14 = uVar14 | bVar3;
    dVar18 = ON_PlaneEquation::ValueAt((ON_PlaneEquation *)(Sbuffer + 4),*pOVar10);
    *(double *)((long)v[2] + lVar9) = dVar18;
    uVar8 = uVar14 | 2;
    if ((double)CONCAT44(uStack_a14,local_a18) <= dVar18) {
      uVar8 = uVar14;
      bVar12 = bVar12 + 2;
    }
    dVar18 = ON_PlaneEquation::ValueAt((ON_PlaneEquation *)(Sbuffer + 8),*pOVar10);
    *(double *)((long)v[3] + lVar9) = dVar18;
    uVar11 = uVar8 | 4;
    if ((double)CONCAT44(uStack_a14,local_a18) <= dVar18) {
      uVar11 = uVar8;
      bVar12 = bVar12 + 4;
    }
    dVar18 = ON_PlaneEquation::ValueAt((ON_PlaneEquation *)(Sbuffer + 0xc),*pOVar10);
    uVar14 = uVar11 | 8;
    if ((double)CONCAT44(uStack_a14,local_a18) <= dVar18) {
      uVar14 = uVar11;
      bVar12 = bVar12 + 8;
    }
    *(double *)((long)Pbuffer + lVar9) = dVar18;
    if (((vVar1 != perspective_view) ||
        (dVar18 = ON_PlaneEquation::ValueAt((ON_PlaneEquation *)(Sbuffer + 0x10),*pOVar10),
        0.0 < dVar18)) && (bVar12 = bVar12 | 0x10, bVar12 == 0x1f)) {
      local_a58 = (ulong)(uVar5 + 1);
      Pbuffer[local_9d0 * 3 + 0x1a] = pOVar10->z;
      dVar18 = pOVar10->y;
      Pbuffer[local_9d0 * 3 + 0x18] = pOVar10->x;
      Pbuffer[local_9d0 * 3 + 0x19] = dVar18;
      bVar12 = 0x1f;
    }
    bVar7 = bVar7 | bVar12;
    lVar9 = lVar9 + 8;
    pOVar10 = pOVar10 + 1;
  }
  if (uVar5 < 8) {
    if (bVar7 != 0x1f) {
      return 0;
    }
    if (vVar1 == perspective_view) {
      dVar18 = ON_BoundingBox::MinimumDistanceTo(&bbox,this_01);
      bVar3 = dVar18 <= 0.0;
      local_a68 = local_a58;
      if (bVar3) {
        local_a68 = (ulong)(uVar5 + 1);
        Pbuffer[local_a58 * 3 + 0x1a] = (this->m_CamLoc).z;
        dVar18 = (this->m_CamLoc).y;
        Pbuffer[local_a58 * 3 + 0x18] = this_01->x;
        Pbuffer[local_a58 * 3 + 0x19] = dVar18;
      }
      Lbuffer[2] = (this->m_CamLoc).z;
      Lbuffer[0] = this_01->x;
      Lbuffer[1] = (this->m_CamLoc).y;
      Lbuffer[8] = (this->m_CamLoc).z;
      Lbuffer[6] = this_01->x;
      Lbuffer[7] = (this->m_CamLoc).y;
      Lbuffer[0xc] = this_01->x;
      Lbuffer[0xd] = (this->m_CamLoc).y;
      Lbuffer[0xe] = (this->m_CamLoc).z;
      Lbuffer[0x12] = this_01->x;
      Lbuffer[0x13] = (this->m_CamLoc).y;
      Lbuffer[0x14] = (this->m_CamLoc).z;
      this_02 = local_a00;
    }
    else {
      bVar4 = GetNearRect(local_a00,(ON_3dPoint *)Lbuffer,(ON_3dPoint *)(Lbuffer + 6),
                          (ON_3dPoint *)(Lbuffer + 0xc),(ON_3dPoint *)(Lbuffer + 0x12));
      bVar3 = false;
      local_a68 = local_a58;
      if (!bVar4) {
        return 0;
      }
    }
    line = (ON_Line *)Lbuffer;
    bVar4 = GetFarRect(this_02,(ON_3dPoint *)(Lbuffer + 3),(ON_3dPoint *)(Lbuffer + 9),
                       (ON_3dPoint *)(Lbuffer + 0xf),(ON_3dPoint *)(Lbuffer + 0x15));
    if (!bVar4) {
      return 0;
    }
    local_a58 = local_a68;
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 4) {
      if ((*(uint *)((long)&DAT_006e28b0 + lVar9) & ~uVar14) == 0) {
        bVar4 = ON_Intersect(&bbox,line,(double)local_9e8._0_8_,(ON_Interval *)t);
        if (bVar4) {
          uVar16 = SUB84(t[0],0);
          uVar17 = (undefined4)((ulong)t[0] >> 0x20);
          if (vVar1 == perspective_view) {
            if (t[1] < 0.0) goto LAB_00668a67;
            if (t[0] < 0.0) {
              uVar6 = local_a58;
              if (!bVar3) {
                uVar6 = (ulong)((int)local_a58 + 1);
                Pbuffer[local_a58 * 3 + 0x1a] = (this->m_CamLoc).z;
                dVar18 = (this->m_CamLoc).y;
                Pbuffer[local_a58 * 3 + 0x18] = this_01->x;
                Pbuffer[local_a58 * 3 + 0x19] = dVar18;
              }
              t[0] = t[1];
              bVar3 = true;
              local_a58 = uVar6;
              uVar16 = SUB84(t[1],0);
              uVar17 = (int)((ulong)t[1] >> 0x20);
            }
          }
          ON_Line::PointAt(&local_a30,line,(double)CONCAT44(uVar17,uVar16));
          uVar8 = (int)local_a58 + 1;
          Pbuffer[local_a58 * 3 + 0x1a] = local_a30.z;
          Pbuffer[local_a58 * 3 + 0x18] = local_a30.x;
          Pbuffer[local_a58 * 3 + 0x19] = local_a30.y;
          if (t[0] < t[1]) {
            ON_Line::PointAt(&local_a30,line,t[1]);
            uVar6 = (ulong)uVar8;
            Pbuffer[uVar6 * 3 + 0x1a] = local_a30.z;
            Pbuffer[uVar6 * 3 + 0x18] = local_a30.x;
            Pbuffer[uVar6 * 3 + 0x19] = local_a30.y;
            uVar8 = (int)local_a58 + 2;
          }
          local_a58 = (ulong)uVar8;
        }
      }
LAB_00668a67:
      line = line + 1;
    }
    for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
      for (lVar13 = 0; lVar13 != 0xc; lVar13 = lVar13 + 1) {
        uVar14 = (&DAT_006e28d4)[lVar13 * 2];
        dVar18 = v[lVar9][(uint)(&DAT_006e28d0)[lVar13 * 2]];
        uVar6 = local_a58;
        if (dVar18 * v[lVar9][uVar14] < 0.0) {
          dVar18 = dVar18 / (dVar18 - v[lVar9][uVar14]);
          ::operator*(&local_8e0,1.0 - dVar18,
                      (ON_3dPoint *)(Pbuffer + (ulong)(uint)(&DAT_006e28d0)[lVar13 * 2] * 3));
          ::operator*(&local_828,dVar18,(ON_3dPoint *)(Pbuffer + (ulong)uVar14 * 3));
          ON_3dPoint::operator+(&local_a30,&local_8e0,&local_828);
          Pbuffer[local_a58 * 3 + 0x1a] = local_a30.z;
          Pbuffer[local_a58 * 3 + 0x18] = local_a30.x;
          Pbuffer[local_a58 * 3 + 0x19] = local_a30.y;
          this_00 = (ON_PlaneEquation *)Sbuffer;
          lVar15 = 0;
          while ((uVar6 = (ulong)((int)local_a58 + 1), lVar15 != 4 &&
                 ((lVar9 == lVar15 ||
                  (P_00.y = local_a30.y, P_00.x = local_a30.x, P_00.z = local_a30.z,
                  dVar18 = ON_PlaneEquation::ValueAt(this_00,P_00), uVar6 = local_a58,
                  (double)CONCAT44(uStack_a14,local_a18) < dVar18))))) {
            lVar15 = lVar15 + 1;
            this_00 = this_00 + 1;
          }
        }
        local_a58 = uVar6;
      }
    }
    if ((int)local_a58 == 0) {
      return 0;
    }
  }
  ON_3dPoint::operator-((ON_3dVector *)&local_8e0,this_01,(ON_3dPoint *)(Pbuffer + 0x18));
  t[0] = ON_3dVector::operator*((ON_3dVector *)&local_8e0,local_9f8);
  uVar16 = SUB84(t[0],0);
  uVar17 = (undefined4)((ulong)t[0] >> 0x20);
  pOVar10 = (ON_3dPoint *)(Pbuffer + 0x1b);
  t[1] = t[0];
  while (pdVar2 = local_9f0, local_a58 = local_a58 - 1, local_a58 != 0) {
    ON_3dPoint::operator-((ON_3dVector *)&local_8e0,this_01,pOVar10);
    dVar18 = ON_3dVector::operator*((ON_3dVector *)&local_8e0,local_9f8);
    uVar16 = SUB84(dVar18,0);
    uVar17 = (undefined4)((ulong)dVar18 >> 0x20);
    if (t[0] <= dVar18) {
      if (t[1] < dVar18) {
        t[1] = dVar18;
      }
      uVar16 = SUB84(t[0],0);
      uVar17 = (undefined4)((ulong)t[0] >> 0x20);
      dVar18 = t[0];
    }
    t[0] = dVar18;
    pOVar10 = pOVar10 + 1;
  }
  if (vVar1 == perspective_view) {
    if (t[1] < 0.0) {
      return 0;
    }
    if ((double)CONCAT44(uVar17,uVar16) <= 0.0 && (double)CONCAT44(uVar17,uVar16) != 0.0) {
      t[0] = 0.0;
      uVar16 = 0;
      uVar17 = 0;
    }
  }
  if (near_dist == (double *)0x0) {
LAB_00668d00:
    if (pdVar2 == (double *)0x0) goto LAB_00668d43;
    if (bGrowNearFar) goto LAB_00668d0c;
    uVar16 = SUB84(t[1],0);
    uVar17 = (undefined4)((ulong)t[1] >> 0x20);
  }
  else {
    if (!bGrowNearFar) {
LAB_00668cfa:
      *near_dist = (double)CONCAT44(uVar17,uVar16);
      goto LAB_00668d00;
    }
    bVar3 = ON_IsValid(*near_dist);
    uVar16 = SUB84(t[0],0);
    uVar17 = (undefined4)((ulong)t[0] >> 0x20);
    if ((!bVar3) || (t[0] < *near_dist)) goto LAB_00668cfa;
    if (pdVar2 == (double *)0x0) goto LAB_00668d43;
LAB_00668d0c:
    bVar3 = ON_IsValid(*pdVar2);
    uVar16 = SUB84(t[1],0);
    uVar17 = (undefined4)((ulong)t[1] >> 0x20);
    if ((bVar3) && (t[1] < *pdVar2 || t[1] == *pdVar2)) goto LAB_00668d43;
  }
  *pdVar2 = (double)CONCAT44(uVar17,uVar16);
LAB_00668d43:
  return 2 - (uint)(uVar5 < 8);
}

Assistant:

int ON_Viewport::GetBoundingBoxDepth(       
       ON_BoundingBox bbox,
       const ON_Xform* bbox_xform,
       double* near_dist,
       double* far_dist,
       bool bGrowNearFar
       ) const
{
  // The Xbuffer[] stuff is to skip wasting time in unneeded constructors.
  // The buffers are double arrays to insure alignments are correct.
  ON_3dPoint* C;
  ON_3dPoint* P;
  ON_PlaneEquation* S;
  ON_Line* L;
  ON_3dPoint Q;
  double Pbuffer[(8+8+8+48)*(sizeof(P[0])/sizeof(double))];
  double Sbuffer[5*(sizeof(S[0])/sizeof(double))];
  double Lbuffer[4*(sizeof(L[0])/sizeof(double))];
  double d, t[2], v[4][8], v0, v1;
  const double tol = ON_SQRT_EPSILON*(1.0 + m_CamLoc.MaximumCoordinate());
  C = (ON_3dPoint*)Pbuffer;
  P = C+8;
  S = (ON_PlaneEquation*)Sbuffer;
  L = (ON_Line*)Lbuffer;
  unsigned int i, j, k, Pin, Pout, Pcount;
  bool rc;
  bool bTrimmed = false;
  const bool bPerspectiveProjection = (ON::perspective_view == m_projection);

  for (;;)
  {
    rc = bbox.GetCorners(C);
    if (!rc)
      break;
    
    if (nullptr != bbox_xform)
    {
      rc = bbox_xform->IsValid();
      if (!rc)
        break;
    }

    rc = GetFrustumLeftPlaneEquation(S[0]);
    if (!rc)
      break;
    rc = GetFrustumRightPlaneEquation(S[1]);
    if (!rc)
      break;
    rc = GetFrustumBottomPlaneEquation(S[2]);
    if (!rc)
      break;
    rc = GetFrustumTopPlaneEquation(S[3]);
    if (!rc)
      break;

    S[4].Create(m_CamLoc,-m_CamZ);
    
    Pcount = 0;
    Pin = 0;
    Pout = 0;

    for ( i = 0; i < 8; i++ )
    {
      if ( nullptr != bbox_xform )
        C[i] = (*bbox_xform)*C[i];

      k = 0;
      if ( (v[0][i] = S[0].ValueAt(C[i])) >= -tol )
        k |= 1;      
      else
        Pout |= 1;
      if ( (v[1][i] = S[1].ValueAt(C[i])) >= -tol )
        k |= 2;
      else
        Pout |= 2;
      if ( (v[2][i] = S[2].ValueAt(C[i])) >= -tol )
        k |= 4;
      else
        Pout |= 4;
      if ( (v[3][i] = S[3].ValueAt(C[i])) >= -tol )
        k |= 8;
      else
        Pout |= 8;

      if ( !bPerspectiveProjection || S[4].ValueAt(C[i]) > 0.0 )
        k |= 16;

      Pin |= k;
      if ( (1|2|4|8|16) == k )
      {
        // C[i] is inside the infinite frustum
        P[Pcount++] = C[i];
      }
    }

    if ( Pcount < 8 )
    {
      bTrimmed = true;
      // some portion of bbox is outside the infinite frustum
      if ( (1|2|4|8|16) != Pin )
      {
        // bbox does not intersect the infinite frustum.
        rc = false;
        break;
      }

      j = 0;
      if ( bPerspectiveProjection )
      {
        if ( bbox.MinimumDistanceTo(m_CamLoc) <= 0.0 )
        {
          // camera location is in the bounding box
          P[Pcount++] = m_CamLoc;
          j = 1; // j = 1 indicates m_CamLoc has been added to P[].
        }
        L[0].from = m_CamLoc;
        L[1].from = m_CamLoc;
        L[2].from = m_CamLoc;
        L[3].from = m_CamLoc;
      }
      else
      {
        rc = GetNearRect(L[0].from,L[1].from,L[2].from,L[3].from);
        if (!rc)
          break;
      }

      rc = GetFarRect(L[0].to,L[1].to,L[2].to,L[3].to);
      if (!rc)
        break;

      const unsigned int Linout[4] = {
        1|4, // intersection of left and bottom frustum sides
        2|4, // intersection of right and bottom frustum sides
        1|8, // intersection of left and top frustum sides
        2|8  // intersection of right and top frustum sides
        };

      k = Pin & Pout;
      for ( i = 0; i < 4; i++ )
      {
        // The Linout[i] == ... test is true if bbox is on both sides
        // of both planes whose intersection defines the line L[i].
        // The fast integer test helps cull unnecessary calls to
        // the expensive ON_Intersect() function.
        if (    Linout[i] == (k & Linout[i]) 
             && ON_Intersect(bbox,L[i],tol,(ON_Interval*)t) 
           )
        {
          if ( bPerspectiveProjection )
          {
            if ( t[1] < 0.0 )
              continue;
            if ( t[0] < 0.0 )
            {
              if ( 0 == j )
              {
                P[Pcount++] = m_CamLoc;
                j = 1; // j = 1 indicates m_CamLoc has been added to P[].
              }
              t[0] = t[1];
            }
          }
          P[Pcount++] = L[i].PointAt(t[0]);
          if ( t[1] > t[0] )
            P[Pcount++] = L[i].PointAt(t[1]);
        }
      }

      // intersect box edges with frustum sides
      // The 12 bbox edges have endpoints
      // C[e[*][0]] and C[E[*][1]]
      const unsigned int e[12][2] = {
        {0,1},{2,3},{4,5},{6,7},
        {0,2},{1,3},{4,6},{5,7},
        {0,4},{1,5},{2,6},{3,7}};

      for ( i = 0; i < 4; i++ )
      {
        for ( j = 0; j < 12; j++ )
        {
          v0 = v[i][e[j][0]];
          v1 = v[i][e[j][1]];
          if ( v0*v1 < 0.0 )
          {
            // this box edge crosses the frustum side plane
            d = v0/(v0-v1);
            P[Pcount++] = Q = (1.0-d)*C[e[j][0]] + d*C[e[j][1]];
            // verify that Q is in the frustum
            for ( k = 0; k < 4; k++ )
            {
              if ( i != k && S[k].ValueAt(Q) <= -tol )
              {
                // Q is not in the view frustum
                Pcount--;
                break;
              }
            }
          }
        }
      }
      if ( 0 == Pcount )
      {
        rc = false;
        break;
      }
    }

    t[0] = t[1] = (m_CamLoc - P[0])*m_CamZ;
    for ( i = 1; i < Pcount; i++ )
    {
      d = (m_CamLoc - P[i])*m_CamZ;
      if ( d < t[0] )
        t[0] = d;
      else if ( d > t[1] )
        t[1] = d;
    }

    if ( bPerspectiveProjection )
    {
      if ( t[1] < 0.0 )
      {
        rc = false;
        break;
      }
      if ( t[0] < 0.0 )
        t[0] = 0.0;
    }

    if ( 0 != near_dist && (!bGrowNearFar || !ON_IsValid(*near_dist) || t[0] < *near_dist) )
      *near_dist = t[0];
    if ( 0 != far_dist && (!bGrowNearFar || !ON_IsValid(*far_dist) || t[1] > *far_dist) )
      *far_dist = t[1];

    rc = true;
    break;
  }

  // 0 = out, 1 = partially in infinite frustum, 2 = all in infinite frustum
  return (rc) ? (bTrimmed ? 1 : 2) : 0;
}